

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_ghost_int(REF_NODE ref_node,REF_INT *vector,REF_INT ldim)

{
  REF_MPI ref_mpi;
  uint uVar1;
  REF_INT *send_size;
  ulong uVar2;
  REF_INT *recv_size;
  void *pvVar3;
  undefined4 *puVar4;
  int iVar5;
  ulong uVar6;
  void *pvVar7;
  undefined8 uVar8;
  ulong uVar9;
  char *pcVar10;
  uint uVar11;
  int iVar12;
  REF_INT local;
  void *local_80;
  void *local_78;
  ulong local_70;
  void *local_68;
  void *local_60;
  REF_INT *local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  undefined4 *local_38;
  
  ref_mpi = ref_node->ref_mpi;
  uVar9 = (ulong)ref_mpi->n;
  if ((long)uVar9 < 2) {
    return 0;
  }
  local_58 = vector;
  send_size = (REF_INT *)malloc(uVar9 * 4);
  if (send_size == (REF_INT *)0x0) {
    pcVar10 = "malloc a_size of REF_INT NULL";
    uVar8 = 0x398;
  }
  else {
    for (uVar2 = 0; uVar2 < uVar9; uVar2 = uVar2 + 1) {
      send_size[uVar2] = 0;
    }
    recv_size = (REF_INT *)malloc(uVar9 * 4);
    if (recv_size == (REF_INT *)0x0) {
      pcVar10 = "malloc b_size of REF_INT NULL";
      uVar8 = 0x399;
    }
    else {
      for (uVar2 = 0; uVar2 < uVar9; uVar2 = uVar2 + 1) {
        recv_size[uVar2] = 0;
      }
      uVar2 = 0;
      uVar9 = (ulong)(uint)ref_node->max;
      if (ref_node->max < 1) {
        uVar9 = uVar2;
      }
      for (; uVar9 != uVar2; uVar2 = uVar2 + 1) {
        if ((-1 < ref_node->global[uVar2]) && (ref_mpi->id != ref_node->part[uVar2])) {
          send_size[ref_node->part[uVar2]] = send_size[ref_node->part[uVar2]] + 1;
        }
      }
      uVar1 = ref_mpi_alltoall(ref_mpi,send_size,recv_size,1);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x3a2,"ref_node_ghost_int",(ulong)uVar1,"alltoall sizes");
        return uVar1;
      }
      uVar1 = ref_mpi->n;
      uVar9 = 0;
      uVar2 = 0;
      if (0 < (int)uVar1) {
        uVar2 = (ulong)uVar1;
      }
      uVar11 = 0;
      for (; uVar2 != uVar9; uVar9 = uVar9 + 1) {
        uVar11 = uVar11 + send_size[uVar9];
      }
      if ((int)uVar11 < 0) {
        pcVar10 = "malloc a_global of REF_GLOB negative";
        uVar8 = 0x3a6;
LAB_00138fff:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               uVar8,"ref_node_ghost_int",pcVar10);
        return 1;
      }
      local_48 = (ulong)uVar11;
      local_80 = (void *)(ulong)uVar1;
      pvVar3 = malloc(local_48 * 8);
      if (pvVar3 == (void *)0x0) {
        pcVar10 = "malloc a_global of REF_GLOB NULL";
        uVar8 = 0x3a6;
      }
      else {
        uVar1 = 0;
        for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
          uVar1 = uVar1 + recv_size[uVar9];
        }
        if ((int)uVar1 < 0) {
          pcVar10 = "malloc b_global of REF_GLOB negative";
          uVar8 = 0x3aa;
          goto LAB_00138fff;
        }
        local_70 = CONCAT44(local_70._4_4_,uVar1);
        local_50 = (ulong)uVar1;
        local_68 = pvVar3;
        pvVar3 = malloc(local_50 * 8);
        if (pvVar3 == (void *)0x0) {
          pcVar10 = "malloc b_global of REF_GLOB NULL";
          uVar8 = 0x3aa;
        }
        else {
          if ((int)local_80 < 0) {
            pcVar10 = "malloc a_next of REF_INT negative";
            uVar8 = 0x3ac;
            goto LAB_00138fff;
          }
          puVar4 = (undefined4 *)malloc((long)local_80 * 4);
          if (puVar4 == (undefined4 *)0x0) {
            pcVar10 = "malloc a_next of REF_INT NULL";
            uVar8 = 0x3ac;
          }
          else {
            *puVar4 = 0;
            iVar5 = 0;
            for (pvVar7 = (void *)0x1; pvVar7 < local_80; pvVar7 = (void *)((long)pvVar7 + 1)) {
              iVar5 = iVar5 + send_size[(long)pvVar7 + -1];
              puVar4[(long)pvVar7] = iVar5;
            }
            uVar2 = 0;
            uVar9 = (ulong)(uint)ref_node->max;
            if (ref_node->max < 1) {
              uVar9 = uVar2;
            }
            for (; uVar9 != uVar2; uVar2 = uVar2 + 1) {
              if ((-1 < ref_node->global[uVar2]) &&
                 (iVar5 = ref_node->part[uVar2], ref_node->ref_mpi->id != iVar5)) {
                iVar12 = puVar4[iVar5];
                *(REF_GLOB *)((long)local_68 + (long)iVar12 * 8) = ref_node->global[uVar2];
                puVar4[iVar5] = iVar12 + 1;
              }
            }
            local_38 = puVar4;
            uVar1 = ref_mpi_alltoallv(ref_mpi,local_68,send_size,pvVar3,recv_size,1,2);
            if (uVar1 != 0) {
              pcVar10 = "alltoallv global";
              uVar8 = 0x3bc;
LAB_00138fce:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,uVar8,"ref_node_ghost_int",(ulong)uVar1,pcVar10);
              return uVar1;
            }
            iVar5 = (int)(0x7fffffff / (long)ldim);
            if (((int)uVar11 < iVar5) && ((int)local_70 < iVar5)) {
              if ((int)(uVar11 * ldim) < 0) {
                pcVar10 = "malloc a_vector of REF_INT negative";
                uVar8 = 0x3bf;
                goto LAB_00138fff;
              }
              local_78 = malloc((ulong)(uVar11 * ldim) << 2);
              if (local_78 == (void *)0x0) {
                pcVar10 = "malloc a_vector of REF_INT NULL";
                uVar8 = 0x3bf;
              }
              else {
                if ((int)local_70 * ldim < 0) {
                  pcVar10 = "malloc b_vector of REF_INT negative";
                  uVar8 = 0x3c0;
                  goto LAB_00138fff;
                }
                local_60 = pvVar3;
                pvVar3 = malloc((ulong)(uint)((int)local_70 * ldim) << 2);
                if (pvVar3 != (void *)0x0) {
                  uVar9 = 0;
                  uVar2 = 0;
                  if (0 < ldim) {
                    uVar2 = (ulong)(uint)ldim;
                  }
                  local_40 = (long)ldim << 2;
                  local_80 = pvVar3;
                  while (uVar9 != local_50) {
                    local_70 = uVar9;
                    uVar1 = ref_node_local(ref_node,*(REF_GLOB *)((long)local_60 + uVar9 * 8),&local
                                          );
                    if (uVar1 != 0) {
                      pcVar10 = "g2l";
                      uVar8 = 0x3c2;
                      goto LAB_00138fce;
                    }
                    for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
                      *(REF_INT *)((long)pvVar3 + uVar9 * 4) =
                           local_58[(long)(local * ldim) + uVar9];
                    }
                    pvVar3 = (void *)((long)pvVar3 + local_40);
                    uVar9 = local_70 + 1;
                  }
                  uVar1 = ref_mpi_alltoallv(ref_mpi,local_80,recv_size,local_78,send_size,ldim,1);
                  if (uVar1 == 0) {
                    pvVar3 = local_78;
                    for (uVar9 = 0; uVar9 != local_48; uVar9 = uVar9 + 1) {
                      uVar1 = ref_node_local(ref_node,*(REF_GLOB *)((long)local_68 + uVar9 * 8),
                                             &local);
                      if (uVar1 != 0) {
                        pcVar10 = "g2l";
                        uVar8 = 0x3cc;
                        goto LAB_00138fce;
                      }
                      for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
                        local_58[(long)(local * ldim) + uVar6] =
                             *(REF_INT *)((long)pvVar3 + uVar6 * 4);
                      }
                      pvVar3 = (void *)((long)pvVar3 + local_40);
                    }
                    goto LAB_00139469;
                  }
                  pcVar10 = "alltoallv vector";
                  uVar8 = 0x3c9;
                  goto LAB_00138fce;
                }
                pcVar10 = "malloc b_vector of REF_INT NULL";
                uVar8 = 0x3c0;
              }
            }
            else {
              local_78 = malloc(local_48 * 4);
              if (local_78 == (void *)0x0) {
                pcVar10 = "malloc a_vector of REF_INT NULL";
                uVar8 = 0x3d3;
              }
              else {
                local_80 = malloc(local_50 * 4);
                if (local_80 != (void *)0x0) {
                  iVar12 = 0;
                  iVar5 = 0;
                  if (0 < ldim) {
                    iVar5 = ldim;
                  }
                  local_70 = CONCAT44(local_70._4_4_,iVar5);
                  local_60 = pvVar3;
                  for (; iVar12 != iVar5; iVar12 = iVar12 + 1) {
                    for (uVar9 = 0; local_50 != uVar9; uVar9 = uVar9 + 1) {
                      uVar1 = ref_node_local(ref_node,*(REF_GLOB *)((long)local_60 + uVar9 * 8),
                                             &local);
                      if (uVar1 != 0) {
                        pcVar10 = "g2l";
                        uVar8 = 0x3d7;
                        goto LAB_00138fce;
                      }
                      *(REF_INT *)((long)local_80 + uVar9 * 4) = local_58[local * ldim + iVar12];
                    }
                    uVar1 = ref_mpi_alltoallv(ref_mpi,local_80,recv_size,local_78,send_size,1,1);
                    if (uVar1 != 0) {
                      pcVar10 = "alltoallv vector";
                      uVar8 = 0x3dd;
                      goto LAB_00138fce;
                    }
                    for (uVar9 = 0; local_48 != uVar9; uVar9 = uVar9 + 1) {
                      uVar1 = ref_node_local(ref_node,*(REF_GLOB *)((long)local_68 + uVar9 * 8),
                                             &local);
                      if (uVar1 != 0) {
                        pcVar10 = "g2l";
                        uVar8 = 0x3e0;
                        goto LAB_00138fce;
                      }
                      local_58[local * ldim + iVar12] = *(REF_INT *)((long)local_78 + uVar9 * 4);
                    }
                    iVar5 = (int)local_70;
                  }
LAB_00139469:
                  free(local_80);
                  free(local_78);
                  free(local_38);
                  free(local_60);
                  free(local_68);
                  free(recv_size);
                  free(send_size);
                  return 0;
                }
                pcVar10 = "malloc b_vector of REF_INT NULL";
                uVar8 = 0x3d4;
                local_80 = (void *)0x0;
              }
            }
          }
        }
      }
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar8,
         "ref_node_ghost_int",pcVar10);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_node_ghost_int(REF_NODE ref_node, REF_INT *vector,
                                      REF_INT ldim) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_GLOB *a_global, *b_global;
  REF_INT part, node;
  REF_INT *a_next;
  REF_INT *a_vector, *b_vector;
  REF_INT i, local;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  each_ref_node_valid_node(ref_node, node) {
    if (!ref_node_owned(ref_node, node)) {
      a_size[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) { a_total += a_size[part]; }
  ref_malloc(a_global, a_total, REF_GLOB);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) { b_total += b_size[part]; }
  ref_malloc(b_global, b_total, REF_GLOB);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    a_next[part] = a_next[part - 1] + a_size[part - 1];
  }

  each_ref_node_valid_node(ref_node, node) {
    if (!ref_node_owned(ref_node, node)) {
      part = ref_node_part(ref_node, node);
      a_global[a_next[part]] = ref_node_global(ref_node, node);
      a_next[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_global, a_size, b_global, b_size, 1,
                        REF_GLOB_TYPE),
      "alltoallv global");

  if (a_total < REF_INT_MAX / ldim && b_total < REF_INT_MAX / ldim) {
    ref_malloc(a_vector, ldim * a_total, REF_INT);
    ref_malloc(b_vector, ldim * b_total, REF_INT);
    for (node = 0; node < b_total; node++) {
      RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
      for (i = 0; i < ldim; i++)
        b_vector[i + ldim * node] = vector[i + ldim * local];
    }

    RSS(ref_mpi_alltoallv(ref_mpi, b_vector, b_size, a_vector, a_size, ldim,
                          REF_INT_TYPE),
        "alltoallv vector");

    for (node = 0; node < a_total; node++) {
      RSS(ref_node_local(ref_node, a_global[node], &local), "g2l");
      for (i = 0; i < ldim; i++)
        vector[i + ldim * local] = a_vector[i + ldim * node];
    }
    free(b_vector);
    free(a_vector);
  } else {
    ref_malloc(a_vector, a_total, REF_INT);
    ref_malloc(b_vector, b_total, REF_INT);
    for (i = 0; i < ldim; i++) {
      for (node = 0; node < b_total; node++) {
        RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
        b_vector[node] = vector[i + ldim * local];
      }

      RSS(ref_mpi_alltoallv(ref_mpi, b_vector, b_size, a_vector, a_size, 1,
                            REF_INT_TYPE),
          "alltoallv vector");

      for (node = 0; node < a_total; node++) {
        RSS(ref_node_local(ref_node, a_global[node], &local), "g2l");
        vector[i + ldim * local] = a_vector[node];
      }
    }
    free(b_vector);
    free(a_vector);
  }

  free(a_next);
  free(b_global);
  free(a_global);
  free(b_size);
  free(a_size);

  return REF_SUCCESS;
}